

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::MaybeNonFinite<double>(AsciiParser *this,double *out)

{
  bool bVar1;
  value_type *__val;
  uint64_t pos;
  double dVar2;
  vector<char,_std::allocator<char>_> local_40;
  
  pos = CurrLoc(this);
  local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)operator_new(4);
  local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start + 4;
  local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  [0] = '\0';
  local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  [1] = '\0';
  local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  [2] = '\0';
  local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  [3] = '\0';
  local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  bVar1 = CharN(this,3,&local_40);
  if (bVar1) {
    SeekTo(this,pos);
    if (*local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start == 'n') {
      if ((local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start[1] != 'a') ||
         (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[2] != 'n')) goto LAB_003bdfb9;
      dVar2 = NAN;
    }
    else if (((*local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start == 'i') &&
             (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[1] == 'n')) &&
            (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start[2] == 'f')) {
      dVar2 = INFINITY;
    }
    else {
LAB_003bdfb9:
      bVar1 = CharN(this,4,&local_40);
      SeekTo(this,pos);
      if (!bVar1) goto LAB_003be00b;
      if (((*local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start != '-') ||
          (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start[1] != 'i')) ||
         ((local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start[2] != 'n' ||
          (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start[3] != 'f')))) {
        bVar1 = false;
        goto LAB_003be016;
      }
      dVar2 = -INFINITY;
    }
    *out = dVar2;
    bVar1 = true;
  }
  else {
LAB_003be00b:
    bVar1 = false;
    if (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start == (char *)0x0) {
      return false;
    }
  }
LAB_003be016:
  operator_delete(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return bVar1;
}

Assistant:

bool AsciiParser::MaybeNonFinite(T *out) {
  auto loc = CurrLoc();

  // "-inf", "inf" or "nan"
  std::vector<char> buf(4);
  if (!CharN(3, &buf)) {
    return false;
  }
  SeekTo(loc);

  if ((buf[0] == 'i') && (buf[1] == 'n') && (buf[2] == 'f')) {
    (*out) = std::numeric_limits<T>::infinity();
    return true;
  }

  if ((buf[0] == 'n') && (buf[1] == 'a') && (buf[2] == 'n')) {
    (*out) = std::numeric_limits<T>::quiet_NaN();
    return true;
  }

  bool ok = CharN(4, &buf);
  SeekTo(loc);

  if (ok) {
    if ((buf[0] == '-') && (buf[1] == 'i') && (buf[2] == 'n') &&
        (buf[3] == 'f')) {
      (*out) = -std::numeric_limits<T>::infinity();
      return true;
    }

    // NOTE: support "-nan"?
  }

  return false;
}